

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O3

void PrintHelp(char *program)

{
  printf("%s [-options] src_argb.raw dst_yuv.raw\n",program);
  puts(
      " -s <width> <height> .... specify source resolution.  Optional if name contains\n                          resolution (ie. name.1920x800_24Hz_P420.yuv)\n                          Negative value mirrors."
      );
  puts(" -d <width> <height> .... specify destination resolution.");
  puts(" -f <filter> ............ 0 = point, 1 = bilinear (default).");
  puts(" -skip <src_argb> ....... Number of frame to skip of src_argb");
  puts(" -frames <num> .......... Number of frames to convert");
  puts(" -attenuate ............. Attenuate the ARGB image");
  puts(" -unattenuate ........... Unattenuate the ARGB image");
  puts(" -v ..................... verbose");
  puts(" -h ..................... this help");
  exit(0);
}

Assistant:

void PrintHelp(const char* program) {
  printf("%s [-options] src_argb.raw dst_yuv.raw\n", program);
  printf(
      " -s <width> <height> .... specify source resolution.  "
      "Optional if name contains\n"
      "                          resolution (ie. "
      "name.1920x800_24Hz_P420.yuv)\n"
      "                          Negative value mirrors.\n");
  printf(" -d <width> <height> .... specify destination resolution.\n");
  printf(" -f <filter> ............ 0 = point, 1 = bilinear (default).\n");
  printf(" -skip <src_argb> ....... Number of frame to skip of src_argb\n");
  printf(" -frames <num> .......... Number of frames to convert\n");
  printf(" -attenuate ............. Attenuate the ARGB image\n");
  printf(" -unattenuate ........... Unattenuate the ARGB image\n");
  printf(" -v ..................... verbose\n");
  printf(" -h ..................... this help\n");
  exit(0);
}